

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O2

void __thiscall Minisat::SimpSolver::garbageCollect(SimpSolver *this)

{
  ClauseAllocator to;
  ClauseAllocator local_30;
  
  ClauseAllocator::ClauseAllocator
            (&local_30,(this->super_Solver).ca.ra.sz - (this->super_Solver).ca.ra.wasted_);
  local_30.extra_clause_field = (this->super_Solver).ca.extra_clause_field;
  relocAll(this,&local_30);
  Solver::relocAll(&this->super_Solver,&local_30);
  if (1 < (this->super_Solver).verbosity) {
    printf("|  Garbage collection:   %12d bytes => %12d bytes             |\n",
           (ulong)((this->super_Solver).ca.ra.sz << 2),(ulong)(local_30.ra.sz << 2));
  }
  ClauseAllocator::moveTo(&local_30,&(this->super_Solver).ca);
  free(local_30.ra.memory);
  return;
}

Assistant:

void SimpSolver::garbageCollect()
{
    // Initialize the next region to a size corresponding to the estimated utilization degree. This
    // is not precise but should avoid some unnecessary reallocations for the new region:
    ClauseAllocator to(ca.size() - ca.wasted()); 

    to.extra_clause_field = ca.extra_clause_field; // NOTE: this is important to keep (or lose) the extra fields.
    relocAll(to);
    Solver::relocAll(to);
    if (verbosity >= 2)
        printf("|  Garbage collection:   %12d bytes => %12d bytes             |\n", 
               ca.size()*ClauseAllocator::Unit_Size, to.size()*ClauseAllocator::Unit_Size);
    to.moveTo(ca);
}